

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

void __thiscall MppBufferService::destroy_group(MppBufferService *this,MppBufferGroupImpl *group)

{
  RK_U32 RVar1;
  MppBufferMode MVar2;
  MppBufferType MVar3;
  list_head *plVar4;
  list_head *plVar5;
  hlist_node **pphVar6;
  hlist_node *phVar7;
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  undefined4 uVar8;
  undefined8 uVar9;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  RVar1 = group->group_id;
  MVar2 = group->mode;
  MVar3 = group->type;
  if (group->count_used != 0) {
    uVar9 = CONCAT44(uVar8,0x4a0);
    _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"group->count_used == 0",
               "destroy_group",uVar9);
    uVar8 = (undefined4)((ulong)uVar9 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0015bfa2;
  }
  if (group->count_unused != 0) {
    _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
               "group->count_unused == 0","destroy_group",CONCAT44(uVar8,0x4a1));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0015bfa2:
      abort();
    }
  }
  if ((group->count_unused != 0) || (group->count_used != 0)) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_group_deinit mismatch counter used %4d unused %4d found\n"
               ,(char *)0x0,(ulong)(uint)group->count_used);
    group->count_used = 0;
    group->count_unused = 0;
  }
  buf_grp_add_log(group,GRP_DESTROY,"destroy_group");
  plVar4 = (group->list_group).next;
  plVar5 = (group->list_group).prev;
  plVar4->prev = plVar5;
  plVar5->next = plVar4;
  (group->list_group).next = &group->list_group;
  (group->list_group).prev = &group->list_group;
  pphVar6 = (group->hlist).pprev;
  if (pphVar6 != (hlist_node **)0x0) {
    phVar7 = (group->hlist).next;
    *pphVar6 = phVar7;
    if (phVar7 != (hlist_node *)0x0) {
      phVar7->pprev = pphVar6;
    }
    (group->hlist).next = (hlist_node *)0x0;
    (group->hlist).pprev = (hlist_node **)0x0;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&group->buf_lock);
  __mutex = (pthread_mutex_t *)group->logs;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy(__mutex);
    mpp_osal_free("buf_logs_deinit",__mutex);
    group->logs = (MppBufLogs *)0x0;
  }
  mpp_mem_pool_put_f("destroy_group",mpp_buf_grp_pool,group);
  this->group_count = this->group_count - 1;
  if (RVar1 == this->misc[MVar2][MVar3]) {
    this->misc[MVar2][MVar3] = 0;
    this->misc_count = this->misc_count - 1;
  }
  return;
}

Assistant:

void MppBufferService::destroy_group(MppBufferGroupImpl *group)
{
    MppBufferMode mode = group->mode;
    MppBufferType type = group->type;
    RK_U32 id = group->group_id;

    mpp_assert(group->count_used == 0);
    mpp_assert(group->count_unused == 0);
    if (group->count_unused || group->count_used) {
        mpp_err("mpp_buffer_group_deinit mismatch counter used %4d unused %4d found\n",
                group->count_used, group->count_unused);
        group->count_unused = 0;
        group->count_used   = 0;
    }

    buf_grp_add_log(group, GRP_DESTROY, __FUNCTION__);

    list_del_init(&group->list_group);
    hash_del(&group->hlist);
    pthread_mutex_destroy(&group->buf_lock);
    if (group->logs) {
        buf_logs_deinit(group->logs);
        group->logs = NULL;
    }
    mpp_mem_pool_put(mpp_buf_grp_pool, group);
    group_count--;

    if (id == misc[mode][type]) {
        misc[mode][type] = 0;
        misc_count--;
    }
}